

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase726::run(TestCase726 *this)

{
  LocalMap *pLVar1;
  long lVar2;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  SourceLocation location_02;
  SourceLocation location_03;
  SourceLocation location_04;
  SourceLocation location_05;
  SourceLocation location_06;
  SourceLocation location_07;
  SourceLocation location_08;
  SourceLocation location_09;
  SourceLocation location_10;
  SourceLocation location_11;
  SourceLocation location_12;
  SourceLocation location_13;
  SourceLocation location_14;
  SourceLocation location_15;
  SourceLocation location_16;
  SourceLocation location_17;
  SourceLocation location_18;
  SourceLocation location_19;
  SourceLocation location_20;
  long lVar3;
  PromiseBase PVar4;
  PromiseBase PVar5;
  PromiseBase PVar6;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:743:28),_void>
  PVar7;
  ReducePromises<int> RVar8;
  __pid_t _Var9;
  void *pvVar10;
  PromiseFulfiller<int> *pPVar11;
  ulong uVar12;
  Promise<int> *pPVar13;
  PromiseBase PVar14;
  TransformPromiseNodeBase *pTVar15;
  EventLoop *pEVar16;
  WaitScope waitScope_6;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:773:28),_void>
  right_4;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:743:28),_void>
  right_1;
  ArrayDisposer *pAStack_8b0;
  ArrayDisposer *local_8a8;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:731:27),_void>
  left;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:772:27),_void>
  left_4;
  OwnPromiseNode local_870;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:798:28),_void>
  right_6;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:819:27),_void>
  left_7;
  PromiseFulfillerPair<int> right;
  undefined1 local_7e0 [8];
  DebugComparison<int,_int> _kjCondition;
  WaitScope waitScope;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  yield();
  pLVar1 = *(LocalMap **)&(waitScope_6.loop)->running;
  uVar12 = (long)waitScope_6.loop - (long)pLVar1;
  pPVar13 = (Promise<int> *)CONCAT71((int7)(uVar12 >> 8),0x27 < uVar12);
  if (pLVar1 != (LocalMap *)0x0 && 0x27 < uVar12) {
    (waitScope_6.loop)->running = false;
    (waitScope_6.loop)->lastRunnableState = false;
    *(undefined6 *)&(waitScope_6.loop)->field_0xa = 0;
    pTVar15 = (TransformPromiseNodeBase *)&waitScope_6.loop[-1].localMap;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar15,(OwnPromiseNode *)&waitScope_6,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:731:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    waitScope_6.loop[-1].localMap.ptr.disposer = (Disposer *)&PTR_destroy_005795b8;
    waitScope_6.loop[-1].localMap.ptr.ptr = pLVar1;
  }
  else {
    pvVar10 = operator_new(0x400);
    pTVar15 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar15,(OwnPromiseNode *)&waitScope_6,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:731:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar10 + 0x3d8) = &PTR_destroy_005795b8;
    *(void **)((long)pvVar10 + 0x3e0) = pvVar10;
  }
  _kjCondition.left = 0;
  _kjCondition.right = 0;
  left.super_PromiseBase.node.ptr._0_4_ = SUB84(pTVar15,0);
  left.super_PromiseBase.node.ptr._4_4_ = (uint)((ulong)pTVar15 >> 0x20);
  right.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
  location_19.function = (char *)local_8a8;
  location_19.fileName = (char *)pAStack_8b0;
  location_19.lineNumber = left.super_PromiseBase.node.ptr._0_4_;
  location_19.columnNumber = left.super_PromiseBase.node.ptr._4_4_;
  newPromiseAndFulfiller<int>(location_19);
  arr<kj::Promise<int>,kj::Promise<int>>
            ((Array<kj::Promise<int>_> *)&waitScope_6,(kj *)&left,&right.promise,pPVar13);
  location.function = "run";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location.lineNumber = 0x2df;
  location.columnNumber = 0x28;
  raceSuccessful<int>((Array<kj::Promise<int>_> *)&right_1,location);
  _kjCondition.right = Promise<int>::wait(&right_1,&waitScope);
  _kjCondition.result = _kjCondition.right == 0x7b;
  _kjCondition.left = 0x7b;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right_1);
  Array<kj::Promise<int>_>::~Array((Array<kj::Promise<int>_> *)&waitScope_6);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    left_4.super_PromiseBase.node.ptr._0_4_ = 0x7b;
    arr<kj::Promise<int>,kj::Promise<int>>
              ((Array<kj::Promise<int>_> *)&waitScope_6,(kj *)&left,&right.promise,pPVar13);
    location_00.function = "run";
    location_00.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_00.lineNumber = 0x2df;
    location_00.columnNumber = 0x28;
    raceSuccessful<int>((Array<kj::Promise<int>_> *)&right_1,location_00);
    right_4.super_PromiseBase.node.ptr._0_4_ = Promise<int>::wait(&right_1,&waitScope);
    kj::_::Debug::log<char_const(&)[106],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2df,ERROR,
               "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope)"
               ,(char (*) [106])
                "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope))"
               ,&_kjCondition,(int *)&left_4,(int *)&right_4);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right_1);
    Array<kj::Promise<int>_>::~Array((Array<kj::Promise<int>_> *)&waitScope_6);
  }
  PromiseFulfillerPair<int>::~PromiseFulfillerPair(&right);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&left);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  location_20.function = (char *)local_8a8;
  location_20.fileName = (char *)pAStack_8b0;
  location_20.lineNumber = left.super_PromiseBase.node.ptr._0_4_;
  location_20.columnNumber = left.super_PromiseBase.node.ptr._4_4_;
  newPromiseAndFulfiller<int>(location_20);
  yield();
  lVar3 = CONCAT44(left.super_PromiseBase.node.ptr._4_4_,left.super_PromiseBase.node.ptr._0_4_);
  lVar2 = *(long *)(lVar3 + 8);
  uVar12 = lVar3 - lVar2;
  pPVar13 = (Promise<int> *)CONCAT71((int7)(uVar12 >> 8),0x27 < uVar12);
  if (lVar2 != 0 && 0x27 < uVar12) {
    *(undefined8 *)(lVar3 + 8) = 0;
    PVar14.node.ptr = (OwnPromiseNode)(lVar3 + -0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar14.node.ptr,(OwnPromiseNode *)&left,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:743:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)(lVar3 + -0x28) = &PTR_destroy_00579610;
    *(long *)(lVar3 + -0x20) = lVar2;
  }
  else {
    pvVar10 = operator_new(0x400);
    PVar14.node.ptr = (OwnPromiseNode)((long)pvVar10 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar14.node.ptr,(OwnPromiseNode *)&left,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:743:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar10 + 0x3d8) = &PTR_destroy_00579610;
    *(void **)((long)pvVar10 + 0x3e0) = pvVar10;
  }
  _kjCondition.left = 0;
  _kjCondition.right = 0;
  waitScope_6.loop = (EventLoop *)0x0;
  right_1.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar14.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&left);
  arr<kj::Promise<int>,kj::Promise<int>>
            ((Array<kj::Promise<int>_> *)&waitScope_6,(kj *)&right,&right_1,pPVar13);
  location_01.function = "run";
  location_01.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_01.lineNumber = 0x2e9;
  location_01.columnNumber = 0x60;
  raceSuccessful<int>((Array<kj::Promise<int>_> *)&left,location_01);
  _kjCondition.right = Promise<int>::wait(&left,&waitScope);
  _kjCondition.result = _kjCondition.right == 0x7b;
  _kjCondition.left = 0x7b;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&left);
  Array<kj::Promise<int>_>::~Array((Array<kj::Promise<int>_> *)&waitScope_6);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    left_4.super_PromiseBase.node.ptr._0_4_ = 0x7b;
    arr<kj::Promise<int>,kj::Promise<int>>
              ((Array<kj::Promise<int>_> *)&waitScope_6,(kj *)&right,&right_1,pPVar13);
    location_02.function = "run";
    location_02.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_02.lineNumber = 0x2e9;
    location_02.columnNumber = 0x60;
    raceSuccessful<int>((Array<kj::Promise<int>_> *)&left,location_02);
    _Var9 = Promise<int>::wait(&left,&waitScope);
    right_4.super_PromiseBase.node.ptr._0_4_ = _Var9;
    kj::_::Debug::log<char_const(&)[105],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2e9,ERROR,
               "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left.promise), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left.promise), kj::mv(right))).wait(waitScope)"
               ,(char (*) [105])
                "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left.promise), kj::mv(right))).wait(waitScope))"
               ,&_kjCondition,(int *)&left_4,(int *)&right_4);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&left);
    Array<kj::Promise<int>_>::~Array((Array<kj::Promise<int>_> *)&waitScope_6);
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right_1);
  PromiseFulfillerPair<int>::~PromiseFulfillerPair(&right);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  yield();
  pEVar16 = waitScope_6.loop;
  pLVar1 = *(LocalMap **)&(waitScope_6.loop)->running;
  if (pLVar1 == (LocalMap *)0x0 || (ulong)((long)waitScope_6.loop - (long)pLVar1) < 0x28) {
    pvVar10 = operator_new(0x400);
    pTVar15 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar15,(OwnPromiseNode *)&waitScope_6,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:752:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar10 + 0x3d8) = &PTR_destroy_00579668;
    *(void **)((long)pvVar10 + 0x3e0) = pvVar10;
  }
  else {
    (waitScope_6.loop)->running = false;
    (waitScope_6.loop)->lastRunnableState = false;
    *(undefined6 *)&(waitScope_6.loop)->field_0xa = 0;
    pTVar15 = (TransformPromiseNodeBase *)&waitScope_6.loop[-1].localMap;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar15,(OwnPromiseNode *)&waitScope_6,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:752:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    pEVar16[-1].localMap.ptr.disposer = (Disposer *)&PTR_destroy_00579668;
    pEVar16[-1].localMap.ptr.ptr = pLVar1;
  }
  _kjCondition.left = 0;
  _kjCondition.right = 0;
  left.super_PromiseBase.node.ptr._0_4_ = SUB84(pTVar15,0);
  left.super_PromiseBase.node.ptr._4_4_ = (uint)((ulong)pTVar15 >> 0x20);
  right.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
  yield();
  pEVar16 = waitScope_6.loop;
  pLVar1 = *(LocalMap **)&(waitScope_6.loop)->running;
  uVar12 = (long)waitScope_6.loop - (long)pLVar1;
  pPVar13 = (Promise<int> *)CONCAT71((int7)(uVar12 >> 8),0x27 < uVar12);
  if (pLVar1 != (LocalMap *)0x0 && 0x27 < uVar12) {
    (waitScope_6.loop)->running = false;
    (waitScope_6.loop)->lastRunnableState = false;
    *(undefined6 *)&(waitScope_6.loop)->field_0xa = 0;
    PVar14.node.ptr = (OwnPromiseNode)&waitScope_6.loop[-1].localMap;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar14.node.ptr,(OwnPromiseNode *)&waitScope_6,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:753:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    pEVar16[-1].localMap.ptr.disposer = (Disposer *)&PTR_destroy_005796c0;
    pEVar16[-1].localMap.ptr.ptr = pLVar1;
  }
  else {
    pvVar10 = operator_new(0x400);
    PVar14.node.ptr = (OwnPromiseNode)((long)pvVar10 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar14.node.ptr,(OwnPromiseNode *)&waitScope_6,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:753:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar10 + 0x3d8) = &PTR_destroy_005796c0;
    *(void **)((long)pvVar10 + 0x3e0) = pvVar10;
  }
  _kjCondition.left = 0;
  _kjCondition.right = 0;
  right.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  right_1.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar14.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
  arr<kj::Promise<int>,kj::Promise<int>>
            ((Array<kj::Promise<int>_> *)&right,(kj *)&left,&right_1,pPVar13);
  location_03.function = "run";
  location_03.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_03.lineNumber = 0x2f3;
  location_03.columnNumber = 0x58;
  raceSuccessful<int>((Array<kj::Promise<int>_> *)&waitScope_6,location_03);
  _kjCondition.right = Promise<int>::wait((Promise<int> *)&waitScope_6,&waitScope);
  _kjCondition.result = _kjCondition.right == 0x7b;
  _kjCondition.left = 0x7b;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
  Array<kj::Promise<int>_>::~Array((Array<kj::Promise<int>_> *)&right);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    left_4.super_PromiseBase.node.ptr._0_4_ = 0x7b;
    arr<kj::Promise<int>,kj::Promise<int>>
              ((Array<kj::Promise<int>_> *)&right,(kj *)&left,&right_1,pPVar13);
    location_04.function = "run";
    location_04.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_04.lineNumber = 0x2f3;
    location_04.columnNumber = 0x58;
    raceSuccessful<int>((Array<kj::Promise<int>_> *)&waitScope_6,location_04);
    _Var9 = Promise<int>::wait((Promise<int> *)&waitScope_6,&waitScope);
    right_4.super_PromiseBase.node.ptr._0_4_ = _Var9;
    kj::_::Debug::log<char_const(&)[97],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2f3,ERROR,
               "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
               ,(char (*) [97])
                "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))"
               ,&_kjCondition,(int *)&left_4,(int *)&right_4);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
    Array<kj::Promise<int>_>::~Array((Array<kj::Promise<int>_> *)&right);
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right_1);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&left);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  yield();
  pEVar16 = waitScope_6.loop;
  pLVar1 = *(LocalMap **)&(waitScope_6.loop)->running;
  if (pLVar1 == (LocalMap *)0x0 || (ulong)((long)waitScope_6.loop - (long)pLVar1) < 0x28) {
    pvVar10 = operator_new(0x400);
    pTVar15 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar15,(OwnPromiseNode *)&waitScope_6,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:762:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar10 + 0x3d8) = &PTR_destroy_00579718;
    *(void **)((long)pvVar10 + 0x3e0) = pvVar10;
  }
  else {
    (waitScope_6.loop)->running = false;
    (waitScope_6.loop)->lastRunnableState = false;
    *(undefined6 *)&(waitScope_6.loop)->field_0xa = 0;
    pTVar15 = (TransformPromiseNodeBase *)&waitScope_6.loop[-1].localMap;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar15,(OwnPromiseNode *)&waitScope_6,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:762:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    pEVar16[-1].localMap.ptr.disposer = (Disposer *)&PTR_destroy_00579718;
    pEVar16[-1].localMap.ptr.ptr = pLVar1;
  }
  _kjCondition.left = 0;
  _kjCondition.right = 0;
  left.super_PromiseBase.node.ptr._0_4_ = SUB84(pTVar15,0);
  left.super_PromiseBase.node.ptr._4_4_ = (uint)((ulong)pTVar15 >> 0x20);
  right.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
  yield();
  pEVar16 = waitScope_6.loop;
  pLVar1 = *(LocalMap **)&(waitScope_6.loop)->running;
  uVar12 = (long)waitScope_6.loop - (long)pLVar1;
  pPVar13 = (Promise<int> *)CONCAT71((int7)(uVar12 >> 8),0x27 < uVar12);
  if (pLVar1 != (LocalMap *)0x0 && 0x27 < uVar12) {
    (waitScope_6.loop)->running = false;
    (waitScope_6.loop)->lastRunnableState = false;
    *(undefined6 *)&(waitScope_6.loop)->field_0xa = 0;
    PVar14.node.ptr = (OwnPromiseNode)&waitScope_6.loop[-1].localMap;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar14.node.ptr,(OwnPromiseNode *)&waitScope_6,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:763:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    pEVar16[-1].localMap.ptr.disposer = (Disposer *)&PTR_destroy_00579770;
    pEVar16[-1].localMap.ptr.ptr = pLVar1;
  }
  else {
    pvVar10 = operator_new(0x400);
    PVar14.node.ptr = (OwnPromiseNode)((long)pvVar10 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar14.node.ptr,(OwnPromiseNode *)&waitScope_6,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:763:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar10 + 0x3d8) = &PTR_destroy_00579770;
    *(void **)((long)pvVar10 + 0x3e0) = pvVar10;
  }
  _kjCondition.left = 0;
  _kjCondition.right = 0;
  right.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  left_4.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar14.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
  location_05.function = "run";
  location_05.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_05.lineNumber = 0x2fb;
  location_05.columnNumber = 0x12;
  Promise<int>::eagerlyEvaluate(&right_1,&left_4,location_05);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&left_4);
  arr<kj::Promise<int>,kj::Promise<int>>
            ((Array<kj::Promise<int>_> *)&right,(kj *)&left,&right_1,pPVar13);
  location_06.function = "run";
  location_06.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_06.lineNumber = 0x2fd;
  location_06.columnNumber = 0x58;
  raceSuccessful<int>((Array<kj::Promise<int>_> *)&waitScope_6,location_06);
  _kjCondition.right = Promise<int>::wait((Promise<int> *)&waitScope_6,&waitScope);
  pPVar13 = (Promise<int> *)0x1c8;
  _kjCondition.result = _kjCondition.right == 0x1c8;
  _kjCondition.left = 0x1c8;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
  Array<kj::Promise<int>_>::~Array((Array<kj::Promise<int>_> *)&right);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    left_4.super_PromiseBase.node.ptr._0_4_ = 0x1c8;
    arr<kj::Promise<int>,kj::Promise<int>>
              ((Array<kj::Promise<int>_> *)&right,(kj *)&left,&right_1,pPVar13);
    location_07.function = "run";
    location_07.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_07.lineNumber = 0x2fd;
    location_07.columnNumber = 0x58;
    raceSuccessful<int>((Array<kj::Promise<int>_> *)&waitScope_6,location_07);
    _Var9 = Promise<int>::wait((Promise<int> *)&waitScope_6,&waitScope);
    right_4.super_PromiseBase.node.ptr._0_4_ = _Var9;
    kj::_::Debug::log<char_const(&)[97],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2fd,ERROR,
               "\"failed: expected \" \"(456) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 456, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
               ,(char (*) [97])
                "failed: expected (456) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))"
               ,&_kjCondition,(int *)&left_4,(int *)&right_4);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
    Array<kj::Promise<int>_>::~Array((Array<kj::Promise<int>_> *)&right);
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right_1);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&left);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  yield();
  pEVar16 = waitScope_6.loop;
  pLVar1 = *(LocalMap **)&(waitScope_6.loop)->running;
  if (pLVar1 == (LocalMap *)0x0 || (ulong)((long)waitScope_6.loop - (long)pLVar1) < 0x28) {
    pvVar10 = operator_new(0x400);
    PVar14.node.ptr = (OwnPromiseNode)((long)pvVar10 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar14.node.ptr,(OwnPromiseNode *)&waitScope_6,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:772:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar10 + 0x3d8) = &PTR_destroy_005797c8;
    *(void **)((long)pvVar10 + 0x3e0) = pvVar10;
  }
  else {
    (waitScope_6.loop)->running = false;
    (waitScope_6.loop)->lastRunnableState = false;
    *(undefined6 *)&(waitScope_6.loop)->field_0xa = 0;
    PVar14.node.ptr = (OwnPromiseNode)&waitScope_6.loop[-1].localMap;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar14.node.ptr,(OwnPromiseNode *)&waitScope_6,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:772:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    pEVar16[-1].localMap.ptr.disposer = (Disposer *)&PTR_destroy_005797c8;
    pEVar16[-1].localMap.ptr.ptr = pLVar1;
  }
  _kjCondition.left = 0;
  _kjCondition.right = 0;
  right.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  left_4.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar14.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
  yield();
  PVar7 = right_1;
  lVar2 = *(long *)((long)right_1.super_PromiseBase.node.ptr + 8);
  uVar12 = (long)right_1.super_PromiseBase.node.ptr - lVar2;
  pPVar13 = (Promise<int> *)CONCAT71((int7)(uVar12 >> 8),0x27 < uVar12);
  if (lVar2 != 0 && 0x27 < uVar12) {
    *(undefined8 *)((long)right_1.super_PromiseBase.node.ptr + 8) = 0;
    PVar14.node.ptr = (OwnPromiseNode)((long)right_1.super_PromiseBase.node.ptr + -0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar14.node.ptr,(OwnPromiseNode *)&right_1,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:773:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)PVar7.super_PromiseBase.node.ptr + -0x28) = &PTR_destroy_00579820;
    *(long *)((long)PVar7.super_PromiseBase.node.ptr + -0x20) = lVar2;
  }
  else {
    pvVar10 = operator_new(0x400);
    PVar14.node.ptr = (OwnPromiseNode)((long)pvVar10 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar14.node.ptr,(OwnPromiseNode *)&right_1,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:773:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar10 + 0x3d8) = &PTR_destroy_00579820;
    *(void **)((long)pvVar10 + 0x3e0) = pvVar10;
  }
  _kjCondition._0_8_ = &DAT_003d3151;
  _kjCondition.op.content.ptr = "then";
  _kjCondition.op.content.size_ = 0x4c0000058b;
  location_08.function = &DAT_003d31b0;
  location_08.fileName = &DAT_003d3151;
  location_08.lineNumber = 0x58b;
  location_08.columnNumber = 0x4c;
  right.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar14.node.ptr;
  kj::_::maybeChain<int>((OwnPromiseNode *)&left,&right.promise,location_08);
  PVar14.node.ptr._4_4_ = left.super_PromiseBase.node.ptr._4_4_;
  PVar14.node.ptr._0_4_ = left.super_PromiseBase.node.ptr._0_4_;
  left.super_PromiseBase.node.ptr._0_4_ = 0;
  left.super_PromiseBase.node.ptr._4_4_ = 0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&left);
  waitScope_6.loop = (EventLoop *)0x0;
  right_4.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar14.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right_1);
  arr<kj::Promise<int>,kj::Promise<int>>
            ((Array<kj::Promise<int>_> *)&right,(kj *)&left_4,&right_4,pPVar13);
  location_09.function = "run";
  location_09.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_09.lineNumber = 0x309;
  location_09.columnNumber = 0x58;
  raceSuccessful<int>((Array<kj::Promise<int>_> *)&waitScope_6,location_09);
  _kjCondition.right = Promise<int>::wait((Promise<int> *)&waitScope_6,&waitScope);
  _kjCondition.result = _kjCondition.right == 0x7b;
  _kjCondition.left = 0x7b;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
  Array<kj::Promise<int>_>::~Array((Array<kj::Promise<int>_> *)&right);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    left.super_PromiseBase.node.ptr._0_4_ = 0x7b;
    arr<kj::Promise<int>,kj::Promise<int>>
              ((Array<kj::Promise<int>_> *)&right,(kj *)&left_4,&right_4,pPVar13);
    location_10.function = "run";
    location_10.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_10.lineNumber = 0x309;
    location_10.columnNumber = 0x58;
    raceSuccessful<int>((Array<kj::Promise<int>_> *)&waitScope_6,location_10);
    _Var9 = Promise<int>::wait((Promise<int> *)&waitScope_6,&waitScope);
    right_1.super_PromiseBase.node.ptr._0_4_ = _Var9;
    kj::_::Debug::log<char_const(&)[97],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x309,ERROR,
               "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
               ,(char (*) [97])
                "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))"
               ,&_kjCondition,(int *)&left,(int *)&right_1);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
    Array<kj::Promise<int>_>::~Array((Array<kj::Promise<int>_> *)&right);
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right_4);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&left_4);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  yield();
  PVar7 = right_1;
  lVar2 = *(long *)((long)right_1.super_PromiseBase.node.ptr + 8);
  if (lVar2 == 0 || (ulong)((long)right_1.super_PromiseBase.node.ptr - lVar2) < 0x28) {
    pvVar10 = operator_new(0x400);
    PVar14.node.ptr = (OwnPromiseNode)((long)pvVar10 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar14.node.ptr,(OwnPromiseNode *)&right_1,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:783:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar10 + 0x3d8) = &PTR_destroy_00579878;
    *(void **)((long)pvVar10 + 0x3e0) = pvVar10;
  }
  else {
    *(undefined8 *)((long)right_1.super_PromiseBase.node.ptr + 8) = 0;
    PVar14.node.ptr = (OwnPromiseNode)((long)right_1.super_PromiseBase.node.ptr + -0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar14.node.ptr,(OwnPromiseNode *)&right_1,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:783:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)PVar7.super_PromiseBase.node.ptr + -0x28) = &PTR_destroy_00579878;
    *(long *)((long)PVar7.super_PromiseBase.node.ptr + -0x20) = lVar2;
  }
  _kjCondition._0_8_ = &DAT_003d3151;
  _kjCondition.op.content.ptr = "then";
  _kjCondition.op.content.size_ = 0x4c0000058b;
  location_11.function = &DAT_003d31b0;
  location_11.fileName = &DAT_003d3151;
  location_11.lineNumber = 0x58b;
  location_11.columnNumber = 0x4c;
  right.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar14.node.ptr;
  kj::_::maybeChain<int>((OwnPromiseNode *)&left,&right.promise,location_11);
  PVar4.node.ptr._4_4_ = left.super_PromiseBase.node.ptr._4_4_;
  PVar4.node.ptr._0_4_ = left.super_PromiseBase.node.ptr._0_4_;
  left.super_PromiseBase.node.ptr._0_4_ = 0;
  left.super_PromiseBase.node.ptr._4_4_ = 0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&left);
  waitScope_6.loop = (EventLoop *)0x0;
  left_4.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar4.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right_1);
  yield();
  pEVar16 = waitScope_6.loop;
  pLVar1 = *(LocalMap **)&(waitScope_6.loop)->running;
  uVar12 = (long)waitScope_6.loop - (long)pLVar1;
  pPVar13 = (Promise<int> *)CONCAT71((int7)(uVar12 >> 8),0x27 < uVar12);
  if (pLVar1 != (LocalMap *)0x0 && 0x27 < uVar12) {
    (waitScope_6.loop)->running = false;
    (waitScope_6.loop)->lastRunnableState = false;
    *(undefined6 *)&(waitScope_6.loop)->field_0xa = 0;
    pTVar15 = (TransformPromiseNodeBase *)&waitScope_6.loop[-1].localMap;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar15,(OwnPromiseNode *)&waitScope_6,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:786:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    pEVar16[-1].localMap.ptr.disposer = (Disposer *)&PTR_destroy_005798d0;
    pEVar16[-1].localMap.ptr.ptr = pLVar1;
  }
  else {
    pvVar10 = operator_new(0x400);
    pTVar15 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar15,(OwnPromiseNode *)&waitScope_6,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:786:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar10 + 0x3d8) = &PTR_destroy_005798d0;
    *(void **)((long)pvVar10 + 0x3e0) = pvVar10;
  }
  _kjCondition.left = 0;
  _kjCondition.right = 0;
  left.super_PromiseBase.node.ptr._0_4_ = SUB84(pTVar15,0);
  left.super_PromiseBase.node.ptr._4_4_ = (uint)((ulong)pTVar15 >> 0x20);
  right.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
  arr<kj::Promise<int>,kj::Promise<int>>
            ((Array<kj::Promise<int>_> *)&right,(kj *)&left_4,&left,pPVar13);
  location_12.function = "run";
  location_12.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_12.lineNumber = 0x314;
  location_12.columnNumber = 0x58;
  raceSuccessful<int>((Array<kj::Promise<int>_> *)&waitScope_6,location_12);
  _kjCondition.right = Promise<int>::wait((Promise<int> *)&waitScope_6,&waitScope);
  _kjCondition.result = _kjCondition.right == 0x7b;
  _kjCondition.left = 0x7b;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
  Array<kj::Promise<int>_>::~Array((Array<kj::Promise<int>_> *)&right);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    right_1.super_PromiseBase.node.ptr._0_4_ = 0x7b;
    arr<kj::Promise<int>,kj::Promise<int>>
              ((Array<kj::Promise<int>_> *)&right,(kj *)&left_4,&left,pPVar13);
    location_13.function = "run";
    location_13.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_13.lineNumber = 0x314;
    location_13.columnNumber = 0x58;
    raceSuccessful<int>((Array<kj::Promise<int>_> *)&waitScope_6,location_13);
    _Var9 = Promise<int>::wait((Promise<int> *)&waitScope_6,&waitScope);
    right_4.super_PromiseBase.node.ptr._0_4_ = _Var9;
    kj::_::Debug::log<char_const(&)[97],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x314,ERROR,
               "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
               ,(char (*) [97])
                "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))"
               ,&_kjCondition,(int *)&right_1,(int *)&right_4);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
    Array<kj::Promise<int>_>::~Array((Array<kj::Promise<int>_> *)&right);
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&left);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&left_4);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  EventLoop::EventLoop((EventLoop *)&right);
  waitScope_6.busyPollInterval = 0xffffffff;
  waitScope_6.fiber.ptr = (FiberBase *)0x0;
  waitScope_6.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope_6.loop = (EventLoop *)&right;
  EventLoop::enterScope((EventLoop *)&right);
  yield();
  PVar7 = right_1;
  lVar2 = *(long *)((long)right_1.super_PromiseBase.node.ptr + 8);
  if (lVar2 == 0 || (ulong)((long)right_1.super_PromiseBase.node.ptr - lVar2) < 0x28) {
    pvVar10 = operator_new(0x400);
    pEVar16 = (EventLoop *)((long)pvVar10 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)pEVar16,(OwnPromiseNode *)&right_1,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:795:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar10 + 0x3d8) = &PTR_destroy_00579928;
    *(void **)((long)pvVar10 + 0x3e0) = pvVar10;
  }
  else {
    *(undefined8 *)((long)right_1.super_PromiseBase.node.ptr + 8) = 0;
    pEVar16 = (EventLoop *)((long)right_1.super_PromiseBase.node.ptr + -0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)pEVar16,(OwnPromiseNode *)&right_1,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:795:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)PVar7.super_PromiseBase.node.ptr + -0x28) = &PTR_destroy_00579928;
    *(long *)((long)PVar7.super_PromiseBase.node.ptr + -0x20) = lVar2;
  }
  loop.port.ptr = (EventPort *)&DAT_003d3151;
  loop._8_8_ = &DAT_003d31b0;
  loop.head = (Event *)0x4c0000058b;
  location_14.function = &DAT_003d31b0;
  location_14.fileName = &DAT_003d3151;
  location_14.lineNumber = 0x58b;
  location_14.columnNumber = 0x4c;
  waitScope.loop = pEVar16;
  kj::_::maybeChain<int>((OwnPromiseNode *)&left,(Promise<int> *)&waitScope,location_14);
  PVar5.node.ptr._4_4_ = left.super_PromiseBase.node.ptr._4_4_;
  PVar5.node.ptr._0_4_ = left.super_PromiseBase.node.ptr._0_4_;
  left.super_PromiseBase.node.ptr._0_4_ = 0;
  left.super_PromiseBase.node.ptr._4_4_ = 0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&left);
  _kjCondition.left = 0;
  _kjCondition.right = 0;
  right_4.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar5.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right_1);
  yield();
  PVar7 = right_1;
  lVar2 = *(long *)((long)right_1.super_PromiseBase.node.ptr + 8);
  uVar12 = (long)right_1.super_PromiseBase.node.ptr - lVar2;
  pPVar13 = (Promise<int> *)CONCAT71((int7)(uVar12 >> 8),0x27 < uVar12);
  if (lVar2 != 0 && 0x27 < uVar12) {
    *(undefined8 *)((long)right_1.super_PromiseBase.node.ptr + 8) = 0;
    pEVar16 = (EventLoop *)((long)right_1.super_PromiseBase.node.ptr + -0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)pEVar16,(OwnPromiseNode *)&right_1,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:798:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)PVar7.super_PromiseBase.node.ptr + -0x28) = &PTR_destroy_00579980;
    *(long *)((long)PVar7.super_PromiseBase.node.ptr + -0x20) = lVar2;
  }
  else {
    pvVar10 = operator_new(0x400);
    pEVar16 = (EventLoop *)((long)pvVar10 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)pEVar16,(OwnPromiseNode *)&right_1,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:798:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar10 + 0x3d8) = &PTR_destroy_00579980;
    *(void **)((long)pvVar10 + 0x3e0) = pvVar10;
  }
  loop.port.ptr = (EventPort *)&DAT_003d3151;
  loop._8_8_ = &DAT_003d31b0;
  loop.head = (Event *)0x4c0000058b;
  location_15.function = &DAT_003d31b0;
  location_15.fileName = &DAT_003d3151;
  location_15.lineNumber = 0x58b;
  location_15.columnNumber = 0x4c;
  waitScope.loop = pEVar16;
  kj::_::maybeChain<int>((OwnPromiseNode *)&left,(Promise<int> *)&waitScope,location_15);
  PVar6.node.ptr._4_4_ = left.super_PromiseBase.node.ptr._4_4_;
  PVar6.node.ptr._0_4_ = left.super_PromiseBase.node.ptr._0_4_;
  left.super_PromiseBase.node.ptr._0_4_ = 0;
  left.super_PromiseBase.node.ptr._4_4_ = 0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&left);
  _kjCondition.left = 0;
  _kjCondition.right = 0;
  right_6.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar6.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right_1);
  arr<kj::Promise<int>,kj::Promise<int>>
            ((Array<kj::Promise<int>_> *)&left,(kj *)&right_4,&right_6,pPVar13);
  right_1.super_PromiseBase.node.ptr = (PromiseBase)anon_var_dwarf_4f636;
  location_16.function = "operator()";
  location_16.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_16.lineNumber = 0x322;
  location_16.columnNumber = 0x61;
  raceSuccessful<int>((Array<kj::Promise<int>_> *)local_7e0,location_16);
  left_4.super_PromiseBase.node.ptr = (PromiseBase)anon_var_dwarf_4f636;
  Promise<int>::wait((Promise<int> *)local_7e0,&waitScope_6);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_7e0);
  Array<kj::Promise<int>_>::~Array((Array<kj::Promise<int>_> *)&left);
  waitScope.loop = (EventLoop *)((ulong)waitScope.loop & 0xffffffffffffff00);
  kj::_::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)&loop,(NullableValue<kj::Exception> *)&waitScope);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&waitScope);
  if ((char)loop.port.ptr == '\x01') {
    waitScope.loop = (EventLoop *)(ulong)loop.breadthFirstInsertPoint._4_4_;
    waitScope._8_8_ = anon_var_dwarf_4fea7;
    waitScope.fiber.ptr = (FiberBase *)&DAT_00000005;
    waitScope.runningStacksPool.ptr._0_1_ = loop.breadthFirstInsertPoint._4_4_ == 0;
    if ((loop.breadthFirstInsertPoint._4_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[62],kj::_::DebugComparison<kj::Exception::Type,kj::Exception::Type>&,char_const(&)[102],kj::Exception&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x322,ERROR,
                 "\"failed: expected \" \"e.getType() == ::kj::Exception::Type::FAILED\", _kjCondition, \"code threw wrong exception type: \" \"raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)\", e"
                 ,(char (*) [62])"failed: expected e.getType() == ::kj::Exception::Type::FAILED",
                 (DebugComparison<kj::Exception::Type,_kj::Exception::Type> *)&waitScope,
                 (char (*) [102])
                 "code threw wrong exception type: raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
                 ,(Exception *)&loop.running);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[89]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x322,ERROR,
               "\"code did not throw: \" \"raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)\""
               ,(char (*) [89])
                "code did not throw: raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
              );
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&loop);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right_6);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right_4);
  WaitScope::~WaitScope(&waitScope_6);
  EventLoop::~EventLoop((EventLoop *)&right);
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  yield();
  lVar3 = CONCAT44(local_870.ptr._4_4_,(__pid_t)local_870.ptr);
  lVar2 = *(long *)(lVar3 + 8);
  if (lVar2 == 0 || (ulong)(lVar3 - lVar2) < 0x28) {
    pvVar10 = operator_new(0x400);
    pEVar16 = (EventLoop *)((long)pvVar10 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)pEVar16,&local_870,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:819:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar10 + 0x3d8) = &PTR_destroy_00579a28;
    *(void **)((long)pvVar10 + 0x3e0) = pvVar10;
  }
  else {
    *(undefined8 *)(lVar3 + 8) = 0;
    pEVar16 = (EventLoop *)(lVar3 + -0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)pEVar16,&local_870,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:819:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)(lVar3 + -0x28) = &PTR_destroy_00579a28;
    *(long *)(lVar3 + -0x20) = lVar2;
  }
  _kjCondition._0_8_ = &DAT_003d3151;
  _kjCondition.op.content.ptr = "then";
  _kjCondition.op.content.size_ = 0x4c0000058b;
  waitScope_6.loop = pEVar16;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&right,(OwnPromiseNode *)&waitScope_6,
             (SourceLocation *)&_kjCondition);
  RVar8 = right.promise;
  right.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer> *)&right);
  right_6.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right_6);
  left_7.super_PromiseBase.node.ptr = RVar8.super_PromiseBase.node.ptr;
  right_4.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right_4);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_870);
  pPVar11 = (PromiseFulfiller<int> *)operator_new(0x18);
  pPVar11[2].super_PromiseRejector._vptr_PromiseRejector = (_func_int **)0x0;
  (pPVar11->super_PromiseRejector)._vptr_PromiseRejector = (_func_int **)&PTR_reject_00579a80;
  pPVar11[1].super_PromiseRejector._vptr_PromiseRejector = (_func_int **)&PTR_disposeImpl_00579ab8;
  _kjCondition._0_8_ = (Disposer *)(pPVar11 + 1);
  pvVar10 = operator_new(0x400);
  PVar14.node.ptr = (OwnPromiseNode)((long)pvVar10 + 0x228);
  *(undefined8 *)((long)pvVar10 + 0x238) = 0;
  *(undefined ***)((long)pvVar10 + 0x228) = &PTR_destroy_00579b30;
  *(undefined ***)((long)pvVar10 + 0x240) = &PTR_reject_00579b80;
  *(undefined1 *)((long)pvVar10 + 0x248) = 0;
  *(undefined1 *)((long)pvVar10 + 0x3e0) = 0;
  *(undefined1 *)((long)pvVar10 + 1000) = 1;
  *(_func_int ***)((long)pvVar10 + 0x3f0) = (_func_int **)((long)pvVar10 + 0x240);
  *(PromiseFulfiller<int> **)((long)pvVar10 + 0x3f8) = pPVar11;
  waitScope_6.loop = (EventLoop *)0x0;
  pPVar11[2].super_PromiseRejector._vptr_PromiseRejector = (_func_int **)((long)pvVar10 + 0x240);
  *(void **)((long)pvVar10 + 0x230) = pvVar10;
  right_4.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  _kjCondition.op.content.ptr = (char *)0x0;
  right.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar14.node.ptr;
  right.fulfiller.disposer = (Disposer *)(pPVar11 + 1);
  right.fulfiller.ptr = pPVar11;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right_4);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&waitScope_6);
  Own<kj::_::WeakFulfiller<NoCopy>,_std::nullptr_t>::~Own
            ((Own<kj::_::WeakFulfiller<NoCopy>,_std::nullptr_t> *)&_kjCondition);
  arr<kj::Promise<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>,kj::Promise<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>>
            ((Array<kj::Promise<NoCopy>_> *)&waitScope_6,(kj *)&left_7,(Promise<NoCopy> *)&right,
             (Promise<NoCopy> *)PVar14.node.ptr);
  location_17.function = "run";
  location_17.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_17.lineNumber = 0x337;
  location_17.columnNumber = 0x2a;
  raceSuccessful<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>
            ((Array<kj::Promise<NoCopy>_> *)&right_4,location_17);
  _Var9 = Promise<NoCopy>::wait((Promise<NoCopy> *)&right_4,&waitScope);
  _kjCondition.result = _Var9 == 0x7b;
  _kjCondition.right = _Var9;
  _kjCondition.left = 0x7b;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right_4);
  Array<kj::Promise<NoCopy>_>::~Array((Array<kj::Promise<NoCopy>_> *)&waitScope_6);
  if ((_Var9 != 0x7b) && (kj::_::Debug::minSeverity < 3)) {
    right_6.super_PromiseBase.node.ptr._0_4_ = 0x7b;
    arr<kj::Promise<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>,kj::Promise<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>>
              ((Array<kj::Promise<NoCopy>_> *)&waitScope_6,(kj *)&left_7,(Promise<NoCopy> *)&right,
               (Promise<NoCopy> *)PVar14.node.ptr);
    location_18.function = "run";
    location_18.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_18.lineNumber = 0x337;
    location_18.columnNumber = 0x2a;
    raceSuccessful<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>
              ((Array<kj::Promise<NoCopy>_> *)&right_4,location_18);
    local_870.ptr._0_4_ = Promise<NoCopy>::wait((Promise<NoCopy> *)&right_4,&waitScope);
    kj::_::Debug::log<char_const(&)[108],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x337,ERROR,
               "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope).i)\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope).i"
               ,(char (*) [108])
                "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope).i)"
               ,&_kjCondition,(int *)&right_6,(int *)&local_870);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&right_4);
    Array<kj::Promise<NoCopy>_>::~Array((Array<kj::Promise<NoCopy>_> *)&waitScope_6);
  }
  PromiseFulfillerPair<NoCopy>::~PromiseFulfillerPair((PromiseFulfillerPair<NoCopy> *)&right);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&left_7);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, RaceSuccessful) {
  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = newPromiseAndFulfiller<int>(); // never fulfilled

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise)))
                       .wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = newPromiseAndFulfiller<int>(); // never fulfilled
    auto right = evalLater([&]() { return 123; });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left.promise), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = evalLater([&]() { return 456; });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = evalLater([&]() { return 456; }).eagerlyEvaluate(nullptr);

    EXPECT_EQ(456, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }
  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });
    auto right = evalLater([&]() { return 123; });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });
    auto right = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });

    KJ_EXPECT_THROW(FAILED, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    struct NoCopy {
      int i;

      NoCopy(int i) : i(i) {}
      NoCopy(const NoCopy&) = delete;

      NoCopy(NoCopy&&) = default;
      NoCopy& operator=(NoCopy&&) = default;
    };

    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([]() -> kj::Promise<NoCopy> { return NoCopy(123); });
    kj::PromiseFulfillerPair<NoCopy> right = newPromiseAndFulfiller<NoCopy>(); // never fulfilled

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise)))
                       .wait(waitScope).i);
  }
}